

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

char * append_str(char *zText,int n,int p1,int p2)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  char zInt [40];
  char acStack_58 [40];
  
  if (zText == (char *)0x0) {
    append_str::used = 0;
    pcVar3 = append_str::z;
  }
  else {
    sVar2 = (size_t)(uint)n;
    if (n < 1) {
      if ((n < 0) && (append_str::used = append_str::used + n, append_str::used < 0)) {
        __assert_fail("used>=0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/misc/lemon.c"
                      ,0xcea,"char *append_str(const char *, int, int, int)");
      }
      sVar2 = strlen(zText);
    }
    uVar6 = (uint)sVar2;
    if (append_str::alloced <= (int)(append_str::used + uVar6 + 0x50)) {
      append_str::alloced = append_str::used + uVar6 + 0x118;
      append_str::z = (char *)realloc(append_str::z,(long)append_str::alloced);
    }
    pcVar3 = append_str::z;
    if (append_str::z == (char *)0x0) {
      pcVar3 = append_str::empty;
    }
    else {
      while (append_str::z = pcVar3, 0 < (int)uVar6) {
        pcVar7 = zText + 1;
        iVar5 = (int)sVar2;
        if ((iVar5 == 1 || *zText != '%') || (*pcVar7 != 'd')) {
          uVar6 = iVar5 - 1;
          lVar4 = (long)append_str::used;
          append_str::used = append_str::used + 1;
          pcVar3[lVar4] = *zText;
        }
        else {
          sprintf(acStack_58,"%d",(ulong)(uint)p1);
          iVar1 = append_str::used;
          pcVar3 = append_str::z + append_str::used;
          strcpy(pcVar3,acStack_58);
          sVar2 = strlen(pcVar3);
          append_str::used = (int)sVar2 + iVar1;
          pcVar7 = zText + 2;
          uVar6 = iVar5 - 2;
          p1 = p2;
        }
        sVar2 = (size_t)uVar6;
        zText = pcVar7;
        pcVar3 = append_str::z;
      }
      pcVar3[append_str::used] = '\0';
    }
  }
  return pcVar3;
}

Assistant:

PRIVATE char *append_str(const char *zText, int n, int p1, int p2){
  static char empty[1] = { 0 };
  static char *z = 0;
  static int alloced = 0;
  static int used = 0;
  int c;
  char zInt[40];
  if( zText==0 ){
    used = 0;
    return z;
  }
  if( n<=0 ){
    if( n<0 ){
      used += n;
      assert( used>=0 );
    }
    n = lemonStrlen(zText);
  }
  if( (int) (n+sizeof(zInt)*2+used) >= alloced ){
    alloced = n + sizeof(zInt)*2 + used + 200;
    z = (char *) realloc(z,  alloced);
  }
  if( z==0 ) return empty;
  while( n-- > 0 ){
    c = *(zText++);
    if( c=='%' && n>0 && zText[0]=='d' ){
      sprintf(zInt, "%d", p1);
      p1 = p2;
      strcpy(&z[used], zInt);
      used += lemonStrlen(&z[used]);
      zText++;
      n--;
    }else{
      z[used++] = c;
    }
  }
  z[used] = 0;
  return z;
}